

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_32sto14u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  OPJ_INT32 OVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar3 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      uVar1 = pSrc[uVar3];
      uVar4 = pSrc[uVar3 + 1];
      uVar6 = pSrc[uVar3 + 2];
      OVar2 = pSrc[uVar3 + 3];
      *pDst = (OPJ_BYTE)(uVar1 >> 6);
      pDst[1] = (byte)(uVar4 >> 0xc) | (byte)(uVar1 << 2);
      pDst[2] = (OPJ_BYTE)(uVar4 >> 4);
      pDst[3] = (byte)(uVar6 >> 10) | (byte)(uVar4 << 4);
      pDst[4] = (OPJ_BYTE)(uVar6 >> 2);
      pDst[5] = (byte)((uint)OVar2 >> 8) | (byte)(uVar6 << 6);
      pDst[6] = (OPJ_BYTE)OVar2;
      pDst = pDst + 7;
      uVar3 = uVar3 + 4;
    } while (uVar3 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    uVar1 = pSrc[uVar3];
    uVar4 = 0;
    iVar5 = (int)(length & 3);
    if (iVar5 == 1) {
      uVar6 = 0;
      uVar4 = 0;
    }
    else {
      uVar6 = pSrc[uVar3 + 1];
      if (iVar5 == 3) {
        uVar4 = pSrc[uVar3 + 2];
      }
    }
    *pDst = (OPJ_BYTE)(uVar1 >> 6);
    pDst[1] = (byte)(uVar6 >> 0xc) | (byte)(uVar1 << 2);
    if (iVar5 != 1) {
      pDst[2] = (OPJ_BYTE)(uVar6 >> 4);
      pDst[3] = (byte)(uVar4 >> 10) | (byte)(uVar6 << 4);
      if (iVar5 == 3) {
        pDst[4] = (OPJ_BYTE)(uVar4 >> 2);
        pDst[5] = (char)uVar4 << 6;
      }
    }
  }
  return;
}

Assistant:

static void tif_32sto14u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];

        *pDst++ = (OPJ_BYTE)(src0 >> 6);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
        *pDst++ = (OPJ_BYTE)(src1 >> 4);
        *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
        *pDst++ = (OPJ_BYTE)(src2 >> 2);
        *pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | (src3 >> 8));
        *pDst++ = (OPJ_BYTE)(src3);
    }

    if (length & 3U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        length = length & 3U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
            }
        }
        *pDst++ = (OPJ_BYTE)(src0 >> 6);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
        if (length > 1U) {
            *pDst++ = (OPJ_BYTE)(src1 >> 4);
            *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
            if (length > 2U) {
                *pDst++ = (OPJ_BYTE)(src2 >> 2);
                *pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
            }
        }
    }
}